

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

bool __thiscall ON_wString::FormatVargs(ON_wString *this,wchar_t *format,__va_list_tag *args)

{
  int iVar1;
  wchar_t *buffer;
  bool bVar2;
  int len_string;
  ON_wString local_38;
  ON_wString temp;
  int len_count;
  __va_list_tag *args_local;
  wchar_t *format_local;
  ON_wString *this_local;
  
  temp.m_s._4_4_ = FormatVargsOutputCount(format,args);
  if (0 < temp.m_s._4_4_) {
    ON_wString(&local_38);
    SetLength(&local_38,(long)temp.m_s._4_4_);
    buffer = Array(&local_38);
    iVar1 = FormatVargsIntoBuffer(buffer,(long)temp.m_s._4_4_ + 1,format,args);
    bVar2 = iVar1 == temp.m_s._4_4_;
    if (bVar2) {
      operator=(this,&local_38);
      this_local._7_1_ = 1;
    }
    ~ON_wString(&local_38);
    if (bVar2) goto LAB_0085aa4b;
  }
  Destroy(this);
  Create(this);
  this_local._7_1_ = temp.m_s._4_4_ == 0;
LAB_0085aa4b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_wString::FormatVargs(const wchar_t* format, va_list args)
{
  const int len_count = ON_wString::FormatVargsOutputCount(format, args);
  if (len_count > 0)
  {
    // temp is used because sometimes "this" is an argument as in:
    //   ON_String str = L"filename.ext";
    //   str.Format(L"C:\\%s",str);
    ON_wString temp;
    temp.SetLength(len_count);
    const int len_string = ON_wString::FormatVargsIntoBuffer(temp.Array(), size_t(len_count) + 1, format, args);
    if (len_string == len_count)
    {
      *this = temp;
      return true;
    }
  }
  Destroy();
  Create();
  return (0 == len_count);
}